

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderFieldParsingCases
          (MessageBuilderGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  bool bVar1;
  int i;
  long lVar2;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  __uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
       (tuple<const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
        )SortFieldsByNumber(this->descriptor_);
  for (lVar2 = 0; lVar2 < this->descriptor_->field_count_; lVar2 = lVar2 + 1) {
    field = *(FieldDescriptor **)
             ((long)local_28._M_t.
                    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                    _M_head_impl + lVar2 * 8);
    GenerateBuilderFieldParsingCase(this,printer,field);
    bVar1 = FieldDescriptor::is_packable(field);
    if (bVar1) {
      GenerateBuilderPackedFieldParsingCase(this,printer,field);
    }
  }
  std::
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  ::~unique_ptr((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 *)&local_28);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderFieldParsingCases(
    io::Printer* printer) {
  std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
      SortFieldsByNumber(descriptor_));
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    GenerateBuilderFieldParsingCase(printer, field);
    if (field->is_packable()) {
      GenerateBuilderPackedFieldParsingCase(printer, field);
    }
  }
}